

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O2

void __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::encodeBlock
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint32_t *puVar4;
  uint32_t *in_00;
  sbyte sVar5;
  uint32_t i_2;
  uint bit;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  pointer puVar9;
  uint32_t uVar10;
  uint32_t i;
  long lVar11;
  size_t encodedExceptions_sz;
  
  bit = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[9])(this,in,0x80);
  if (bit < 0x20) {
    encodedExceptions_sz = 0;
    sVar5 = ((byte)bit < 0x21) * (' ' - (byte)bit);
    puVar9 = (this->tobecoded).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->exceptionsPositions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->exceptionsValues).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    for (lVar11 = 0; iVar7 = (int)uVar6, lVar11 != 0x80; lVar11 = lVar11 + 1) {
      uVar1 = in[lVar11];
      if (uVar1 < (uint)(1 << (bit & 0x1f))) {
        puVar9[lVar11] = uVar1;
        uVar8 = uVar6;
      }
      else {
        uVar8 = (ulong)(iVar7 + 1);
        puVar9[lVar11] = uVar1 & (uint)(-1 << sVar5) >> sVar5;
        puVar2[uVar6] = (uint)lVar11;
        puVar3[uVar6] = in[lVar11] >> (bit & 0x1f);
      }
      uVar6 = uVar8;
    }
    if (iVar7 == 0) {
      uVar6 = 0;
    }
    else {
      puVar2 = (this->exceptionsPositions).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar8 = uVar6; uVar8 != 1; uVar8 = uVar8 - 1) {
        puVar9 = puVar2 + (uVar8 - 1);
        *puVar9 = *puVar9 - puVar2[(int)uVar8 - 2];
      }
      puVar4 = (this->exceptionsPositions).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_00 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        if (uVar8 == 0) {
          uVar10 = *puVar4;
        }
        else {
          uVar10 = puVar4[uVar8] - 1;
        }
        in_00[uVar8] = uVar10;
        in_00[(uint)(iVar7 + (int)uVar8)] = puVar3[uVar8] - 1;
      }
      Simple16<false>::encodeArray
                (&this->ecoder,in_00,(ulong)(uint)(iVar7 * 2),out + 1,&encodedExceptions_sz);
      uVar6 = encodedExceptions_sz & 0xffffffff;
      puVar9 = (this->tobecoded).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    *out = (uint)uVar6 | iVar7 << 0x10 | bit << 0x1a;
    usimdpack(puVar9,(__m128i *)(out + uVar6 + 1),bit);
    *nvalue = (long)(uVar6 * 4 + 4 + (ulong)(bit << 2) * 4) >> 2;
  }
  else {
    *out = bit << 0x1a;
    for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 1) {
      out[lVar11 + 1] = in[lVar11];
    }
    *nvalue = 0x81;
  }
  return;
}

Assistant:

void SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t len = BlockSize;

  uint32_t b = findBestB(in, len);
  if (b < 32) {

    uint32_t nExceptions = 0;
    size_t encodedExceptions_sz = 0;

    const uint32_t *const initout(out);
    for (uint32_t i = 0; i < len; i++) {

      if (in[i] >= (1U << b)) {
        tobecoded[i] = in[i] & ((1U << b) - 1);
        exceptionsPositions[nExceptions] = i;
        exceptionsValues[nExceptions] = (in[i] >> b);
        nExceptions++;
      } else {
        tobecoded[i] = in[i];
      }
    }

    if (nExceptions > 0) {

      for (uint32_t i = nExceptions - 1; i > 0; i--) {
        const uint32_t cur = exceptionsPositions[i];
        const uint32_t prev = exceptionsPositions[i - 1];

        exceptionsPositions[i] = cur - prev;
      }

      for (uint32_t i = 0; i < nExceptions; i++) {

        exceptions[i] =
            (i > 0) ? exceptionsPositions[i] - 1 : exceptionsPositions[i];
        exceptions[i + nExceptions] = exceptionsValues[i] - 1;
      }
    }

    if (nExceptions > 0)
      ecoder.encodeArray(&exceptions[0], 2 * nExceptions, out + 1,
                         encodedExceptions_sz);
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ)) |
             (nExceptions << PFORDELTA_EXCEPTSZ) |
             static_cast<uint32_t>(encodedExceptions_sz);
    /* Write exceptional values */

    out += static_cast<uint32_t>(encodedExceptions_sz);
    assert(BlockSize == 128);
    usimdpack(&tobecoded[0], reinterpret_cast<__m128i *>(out), b);
    out += 4 * b;

    nvalue = out - initout;

  } else {
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ));
    for (uint32_t i = 0; i < len; i++)
      out[i] = in[i];
    nvalue = len + 1;
  }
}